

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void FindRulePrecedences(lemon *xp)

{
  symbol *psVar1;
  symbol *psVar2;
  rule *prVar3;
  long lVar4;
  symbol *psVar5;
  long lVar6;
  
  prVar3 = xp->rule;
  do {
    if (prVar3 == (rule *)0x0) {
      return;
    }
    if ((prVar3->precsym == (symbol *)0x0) && (0 < (long)prVar3->nrhs)) {
      psVar5 = prVar3->precsym;
      lVar4 = 0;
      do {
        if (psVar5 != (symbol *)0x0) break;
        psVar1 = prVar3->rhs[lVar4];
        if (psVar1->type == MULTITERMINAL) {
          if (0 < (long)psVar1->nsubsym) {
            lVar6 = 0;
            do {
              psVar2 = psVar1->subsym[lVar6];
              if (-1 < psVar1->subsym[lVar6]->prec) goto LAB_00102efe;
              lVar6 = lVar6 + 1;
            } while (psVar1->nsubsym != lVar6);
          }
        }
        else {
          psVar2 = psVar1;
          if (-1 < psVar1->prec) {
LAB_00102efe:
            psVar5 = psVar2;
            prVar3->precsym = psVar5;
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != prVar3->nrhs);
    }
    prVar3 = prVar3->next;
  } while( true );
}

Assistant:

void FindRulePrecedences(struct lemon *xp)
{
  struct rule *rp;
  for(rp=xp->rule; rp; rp=rp->next){
    if( rp->precsym==0 ){
      int i, j;
      for(i=0; i<rp->nrhs && rp->precsym==0; i++){
        struct symbol *sp = rp->rhs[i];
        if( sp->type==MULTITERMINAL ){
          for(j=0; j<sp->nsubsym; j++){
            if( sp->subsym[j]->prec>=0 ){
              rp->precsym = sp->subsym[j];
              break;
            }
          }
        }else if( sp->prec>=0 ){
          rp->precsym = rp->rhs[i];
        }
      }
    }
  }
  return;
}